

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Int ps_tofixedarray(FT_Byte **acur,FT_Byte *limit,FT_Int max_values,FT_Fixed *values,
                      FT_Int power_ten)

{
  FT_Byte FVar1;
  bool bVar2;
  FT_Byte *pFVar3;
  FT_Int FVar4;
  FT_Fixed FVar5;
  long lVar6;
  FT_Byte *local_40;
  long local_38;
  
  local_40 = *acur;
  FVar4 = 0;
  if (limit <= local_40) goto LAB_001f50cf;
  if (*local_40 == '[') {
    FVar1 = ']';
LAB_001f5024:
    local_40 = local_40 + 1;
    bVar2 = false;
  }
  else {
    if (*local_40 == '{') {
      FVar1 = '}';
      goto LAB_001f5024;
    }
    FVar1 = '\0';
    bVar2 = true;
  }
  local_38 = (long)power_ten;
  lVar6 = 0;
  do {
    if ((limit <= local_40) || (skip_spaces(&local_40,limit), pFVar3 = local_40, limit <= local_40))
    break;
    if (FVar1 == *local_40) {
      local_40 = local_40 + 1;
      break;
    }
    if (max_values <= lVar6 && values != (FT_Fixed *)0x0) break;
    FVar5 = PS_Conv_ToFixed(&local_40,limit,local_38);
    if (values != (FT_Fixed *)0x0) {
      values[lVar6] = FVar5;
    }
    if (pFVar3 == local_40) {
      FVar4 = -1;
      goto LAB_001f50cf;
    }
    lVar6 = lVar6 + 1;
  } while (!bVar2);
  FVar4 = (FT_Int)lVar6;
LAB_001f50cf:
  *acur = local_40;
  return FVar4;
}

Assistant:

static FT_Int
  ps_tofixedarray( FT_Byte*  *acur,
                   FT_Byte*   limit,
                   FT_Int     max_values,
                   FT_Fixed*  values,
                   FT_Int     power_ten )
  {
    FT_Byte*  cur   = *acur;
    FT_Int    count = 0;
    FT_Byte   c, ender;


    if ( cur >= limit )
      goto Exit;

    /* Check for the beginning of an array.  Otherwise, only one number */
    /* will be read.                                                    */
    c     = *cur;
    ender = 0;

    if ( c == '[' )
      ender = ']';
    else if ( c == '{' )
      ender = '}';

    if ( ender )
      cur++;

    /* now, read the values */
    while ( cur < limit )
    {
      FT_Fixed  dummy;
      FT_Byte*  old_cur;


      /* skip whitespace in front of data */
      skip_spaces( &cur, limit );
      if ( cur >= limit )
        goto Exit;

      if ( *cur == ender )
      {
        cur++;
        break;
      }

      old_cur = cur;

      if ( values && count >= max_values )
        break;

      /* call PS_Conv_ToFixed() even if coords == NULL */
      /* to properly parse number at `cur'             */
      *( values ? &values[count] : &dummy ) =
        PS_Conv_ToFixed( &cur, limit, power_ten );

      if ( old_cur == cur )
      {
        count = -1;
        goto Exit;
      }
      else
        count++;

      if ( !ender )
        break;
    }

  Exit:
    *acur = cur;
    return count;
  }